

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O2

bool Eval::loadPatterns(void)

{
  bool bVar1;
  long lVar2;
  float fVar3;
  float value;
  ifstream in;
  byte abStack_210 [488];
  
  std::ifstream::ifstream(&in,"./pattern.bin",_S_in|_S_bin);
  if ((abStack_210[*(long *)(_in + -0x18)] & 5) == 0) {
    for (lVar2 = 0; lVar2 != 0x2b6371; lVar2 = lVar2 + 1) {
      std::istream::read((char *)&in,(long)&value);
      if ((abStack_210[*(long *)(_in + -0x18)] & 5) != 0) {
        std::ifstream::close();
        goto LAB_00106289;
      }
      fVar3 = roundf(value * 10000.0);
      patternValues[lVar2] = (int)fVar3;
    }
    for (lVar2 = 0; lVar2 != 0x44; lVar2 = lVar2 + 4) {
      std::istream::read((char *)&in,(long)&value);
      if ((abStack_210[*(long *)(_in + -0x18)] & 5) != 0) {
        std::ifstream::close();
        goto LAB_00106289;
      }
      fVar3 = roundf(value);
      *(int *)((long)patternCorrection + lVar2) = (int)fVar3;
    }
    bVar1 = true;
    std::ifstream::close();
  }
  else {
LAB_00106289:
    bVar1 = false;
  }
  std::ifstream::~ifstream(&in);
  return bVar1;
}

Assistant:

bool Eval::loadPatterns() {
    std::ifstream in("./pattern.bin", std::ios::binary | std::ios::in);
    if (!in) return false;
    float value;
    for (int i = 0; i < ALL_STAGE_PATTERN_COUNT; i++) {
        in.read((char*)&value, sizeof(value));
        if (!in) {
            in.close();
            return false;
        }
        patternValues[i] = (int)round(value * RULER);
    }
    for (int i = 0; i < STAGES; i++) {
        in.read((char*)&value, sizeof(value));
        if (!in) {
            in.close();
            return false;
        }
        patternCorrection[i] = (int)round(value);
    }
    in.close();
    return true;

}